

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::grabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool implicit)

{
  byte bVar1;
  bool bVar2;
  QGraphicsItem **ppQVar3;
  byte in_DL;
  QGraphicsItem *in_RSI;
  QListSpecialMethodsBase<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *last;
  QEvent grabEvent;
  QEvent ungrabEvent;
  parameter_type in_stack_ffffffffffffff68;
  int line;
  char *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  QListSpecialMethodsBase<QGraphicsItem_*> *event;
  QGraphicsItem *in_stack_ffffffffffffff90;
  QGraphicsItem *item_00;
  QGraphicsScenePrivate *in_stack_ffffffffffffff98;
  QGraphicsScenePrivate *this_00;
  undefined1 *local_60;
  undefined1 *local_58;
  char local_50 [32];
  char local_30 [32];
  QGraphicsItem *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  event = in_RDI;
  local_10 = in_RSI;
  bVar2 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                    (in_RDI,(QGraphicsItem **)in_stack_ffffffffffffff68);
  if (bVar2) {
    ppQVar3 = QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff68)
    ;
    line = (int)((ulong)in_RDI >> 0x20);
    if (*ppQVar3 == local_10) {
      if ((*(uint *)(in_RDI + 0xb8) >> 0xb & 1) == 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT17(bVar1,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78,line,(char *)in_stack_ffffffffffffff68);
        QMessageLogger::warning(local_30,"QGraphicsItem::grabMouse: already a mouse grabber");
      }
      else {
        *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffff7ff;
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(bVar1,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,line,(char *)in_stack_ffffffffffffff68);
      ppQVar3 = QList<QGraphicsItem_*>::constLast
                          ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff68);
      QMessageLogger::warning
                (local_50,"QGraphicsItem::grabMouse: already blocked by mouse grabber: %p",*ppQVar3)
      ;
    }
  }
  else {
    bVar2 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c66a0);
    if (!bVar2) {
      QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff68);
      if ((*(uint *)(in_RDI + 0xb8) >> 0xb & 1) == 0) {
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_60,UngrabMouse);
        sendEvent(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(QEvent *)event);
        QEvent::~QEvent((QEvent *)&local_60);
      }
      else {
        QGraphicsItem::ungrabMouse(in_stack_ffffffffffffff68);
      }
    }
    QList<QGraphicsItem_*>::operator<<((QList<QGraphicsItem_*> *)in_RDI,in_stack_ffffffffffffff68);
    *(uint *)(in_RDI + 0xb8) = *(uint *)(in_RDI + 0xb8) & 0xfffff7ff | (uint)(bVar1 & 1) << 0xb;
    item_00 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&stack0xffffffffffffff90,GrabMouse);
    sendEvent(this_00,item_00,(QEvent *)event);
    QEvent::~QEvent((QEvent *)&stack0xffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::grabMouse(QGraphicsItem *item, bool implicit)
{
    // Append to list of mouse grabber items, and send a mouse grab event.
    if (mouseGrabberItems.contains(item)) {
        if (mouseGrabberItems.constLast() == item) {
            Q_ASSERT(!implicit);
            if (!lastMouseGrabberItemHasImplicitMouseGrab) {
                qWarning("QGraphicsItem::grabMouse: already a mouse grabber");
            } else {
                // Upgrade to an explicit mouse grab
                lastMouseGrabberItemHasImplicitMouseGrab = false;
            }
        } else {
            qWarning("QGraphicsItem::grabMouse: already blocked by mouse grabber: %p",
                     mouseGrabberItems.constLast());
        }
        return;
    }

    // Send ungrab event to the last grabber.
    if (!mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        if (lastMouseGrabberItemHasImplicitMouseGrab) {
            // Implicit mouse grab is immediately lost.
            last->ungrabMouse();
        } else {
            // Just send ungrab event to current grabber.
            QEvent ungrabEvent(QEvent::UngrabMouse);
            sendEvent(last, &ungrabEvent);
        }
    }

    mouseGrabberItems << item;
    lastMouseGrabberItemHasImplicitMouseGrab = implicit;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabMouse);
    sendEvent(item, &grabEvent);
}